

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<double>::ReallocForNuma(TPZVec<double> *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *__dest;
  long in_RDI;
  double *newStore;
  
  if ((*(long *)(in_RDI + 0x10) != 0) && (*(long *)(in_RDI + 8) != 0)) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(in_RDI + 0x10);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    __dest = operator_new__(uVar2);
    memcpy(__dest,*(void **)(in_RDI + 8),*(long *)(in_RDI + 0x10) << 3);
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(void **)(in_RDI + 8) = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}